

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall FIX::BoolField::BoolField(BoolField *this,int field,bool data)

{
  string local_38;
  undefined1 local_15;
  int local_14;
  bool data_local;
  BoolField *pBStack_10;
  int field_local;
  BoolField *this_local;
  
  local_15 = data;
  local_14 = field;
  pBStack_10 = this;
  BoolConvertor::convert_abi_cxx11_(&local_38,(BoolConvertor *)(ulong)(data & 1),data);
  FieldBase::FieldBase(&this->super_FieldBase,field,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__BoolField_00330d10;
  return;
}

Assistant:

explicit BoolField(int field, bool data)
      : FieldBase(field, BoolConvertor::convert(data)) {}